

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

StringRef __thiscall llvm::StringRef::ltrim(StringRef *this,StringRef Chars)

{
  ulong uVar1;
  size_type sVar2;
  StringRef SVar3;
  
  sVar2 = find_first_not_of(this,Chars,0);
  uVar1 = this->Length;
  if (uVar1 <= sVar2) {
    sVar2 = uVar1;
  }
  SVar3.Length = uVar1 - sVar2;
  SVar3.Data = this->Data + sVar2;
  return SVar3;
}

Assistant:

LLVM_NODISCARD
    StringRef ltrim(StringRef Chars = " \t\n\v\f\r") const {
      return drop_front(std::min(Length, find_first_not_of(Chars)));
    }